

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O3

Vec_Ptr_t * Cmd_ReadFiles(char *pFileList)

{
  int iVar1;
  FILE *__stream;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  char *pcVar4;
  size_t sVar5;
  Gia_Man_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  char pBuffer [1000];
  ulong local_428;
  undefined8 local_420;
  byte local_418 [1000];
  
  __stream = fopen(pFileList,"rb");
  if (__stream == (FILE *)0x0) {
    pVVar2 = (Vec_Ptr_t *)0x0;
    printf("File containing list of files \"%s\" cannot be opened.\n",pFileList);
  }
  else {
    pVVar2 = (Vec_Ptr_t *)malloc(0x10);
    pVVar2->nCap = 100;
    pVVar2->nSize = 0;
    ppvVar3 = (void **)malloc(800);
    pVVar2->pArray = ppvVar3;
    pcVar4 = fgets((char *)local_418,1000,__stream);
    if (pcVar4 != (char *)0x0) {
      local_428 = 100;
      local_420 = 0;
      do {
        if ((0x23 < (ulong)local_418[0]) ||
           ((0x900002600U >> ((ulong)local_418[0] & 0x3f) & 1) == 0)) {
          while( true ) {
            sVar5 = strlen((char *)local_418);
            uVar7 = (ulong)local_418[sVar5 - 1];
            if ((0x20 < uVar7) || ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0)) break;
            local_418[sVar5 - 1] = 0;
          }
          pGVar6 = Gia_AigerRead((char *)local_418,0,0,0);
          if (pGVar6 == (Gia_Man_t *)0x0) {
            printf("Cannot read AIG from file \"%s\".\n",local_418);
          }
          else {
            iVar1 = (int)local_428;
            if ((int)local_420 == iVar1) {
              if (iVar1 < 0x10) {
                if (pVVar2->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc(0x80);
                }
                else {
                  ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
                }
                pVVar2->pArray = ppvVar3;
                pVVar2->nCap = 0x10;
                local_428 = 0x10;
              }
              else {
                local_428 = (ulong)(uint)(iVar1 * 2);
                if (pVVar2->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc(local_428 * 8);
                }
                else {
                  ppvVar3 = (void **)realloc(pVVar2->pArray,local_428 * 8);
                }
                pVVar2->pArray = ppvVar3;
                pVVar2->nCap = iVar1 * 2;
              }
            }
            else {
              ppvVar3 = pVVar2->pArray;
            }
            uVar8 = (int)local_420 + 1;
            pVVar2->nSize = uVar8;
            ppvVar3[(int)local_420] = pGVar6;
            local_420 = (ulong)uVar8;
          }
        }
        pcVar4 = fgets((char *)local_418,1000,__stream);
      } while (pcVar4 != (char *)0x0);
    }
    fclose(__stream);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Cmd_ReadFiles( char * pFileList )
{
    Gia_Man_t * pGia;
    Vec_Ptr_t * vAigs;
    char pBuffer[CMD_AUTO_LINE_MAX];
    FILE * pFile = fopen( pFileList, "rb" );
    if ( pFile == NULL )
        { printf( "File containing list of files \"%s\" cannot be opened.\n", pFileList ); return NULL; }
    vAigs = Vec_PtrAlloc( 100 );
    while ( fgets( pBuffer, CMD_AUTO_LINE_MAX, pFile ) != NULL )
    {
        // get the command from the file
        if ( Cmf_IsSpace(pBuffer[0]) || pBuffer[0] == '#')
            continue;
        // skip trailing spaces
        while ( Cmf_IsSpace(pBuffer[strlen(pBuffer)-1]) )
            pBuffer[strlen(pBuffer)-1] = 0;
        // read the file
        pGia = Gia_AigerRead( pBuffer, 0, 0, 0 );
        if ( pGia == NULL )
        {
            printf( "Cannot read AIG from file \"%s\".\n", pBuffer );
            continue;
        }
        Vec_PtrPush( vAigs, pGia );
    }
    fclose( pFile );
    return vAigs;
}